

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeFreeCursor(Vdbe *p,VdbeCursor *pCx)

{
  int *piVar1;
  VdbeSorter *pSorter;
  sqlite3 *db;
  sqlite3_vtab_cursor *psVar2;
  sqlite3_vtab *psVar3;
  
  if (pCx != (VdbeCursor *)0x0) {
    pSorter = pCx->pSorter;
    if (pSorter != (VdbeSorter *)0x0) {
      db = p->db;
      sqlite3VdbeSorterReset(db,pSorter);
      sqlite3_free((pSorter->list).aMemory);
      sqlite3DbFree(db,pSorter);
      pCx->pSorter = (VdbeSorter *)0x0;
    }
    if (pCx->pBt != (Btree *)0x0) {
      sqlite3BtreeClose(pCx->pBt);
      return;
    }
    if (pCx->pCursor != (BtCursor *)0x0) {
      sqlite3BtreeCloseCursor(pCx->pCursor);
      return;
    }
    psVar2 = pCx->pVtabCursor;
    if (psVar2 != (sqlite3_vtab_cursor *)0x0) {
      psVar3 = psVar2->pVtab;
      piVar1 = &psVar3->nRef;
      *piVar1 = *piVar1 + -1;
      (*psVar3->pModule->xClose)(psVar2);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeFreeCursor(Vdbe *p, VdbeCursor *pCx){
  if( pCx==0 ){
    return;
  }
  sqlite3VdbeSorterClose(p->db, pCx);
  if( pCx->pBt ){
    sqlite3BtreeClose(pCx->pBt);
    /* The pCx->pCursor will be close automatically, if it exists, by
    ** the call above. */
  }else if( pCx->pCursor ){
    sqlite3BtreeCloseCursor(pCx->pCursor);
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  else if( pCx->pVtabCursor ){
    sqlite3_vtab_cursor *pVtabCursor = pCx->pVtabCursor;
    const sqlite3_module *pModule = pVtabCursor->pVtab->pModule;
    assert( pVtabCursor->pVtab->nRef>0 );
    pVtabCursor->pVtab->nRef--;
    pModule->xClose(pVtabCursor);
  }
#endif
}